

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

QString * cleanPackageName(QString *__return_storage_ptr__,QString packageName,bool *cleaned)

{
  ushort uVar1;
  storage_type sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  long lVar7;
  ushort ch;
  undefined1 *in_RDX;
  longlong __old_val;
  QChar *c;
  ushort *puVar8;
  QString *__range1;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QString local_698;
  QString local_678;
  QString local_658;
  QString local_638;
  QString local_618;
  QString local_5f8;
  QString local_5d8;
  QString local_5b8;
  QString local_598;
  QString local_578;
  QString local_558;
  QString local_538;
  QString local_518;
  QString local_4f8;
  QString local_4d8;
  QString local_4b8;
  QString local_498;
  QString local_478;
  QString local_458;
  QString local_438;
  QString local_418;
  QString local_3f8;
  QString local_3d8;
  QString local_3b8;
  QString local_398;
  QString local_378;
  QString local_358;
  QString local_338;
  QString local_318;
  QString local_2f8;
  QString local_2d8;
  QString local_2b8;
  QString local_298;
  QString local_278;
  QString local_258;
  QString local_238;
  QString local_218;
  QString local_1f8;
  QString local_1d8;
  QString local_1b8;
  QString local_198;
  QString local_178;
  QString local_158;
  QString local_138;
  QString local_118;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  QString local_98;
  QString local_78;
  QStringView local_58;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  if ((*(int **)cleaned == (int *)0x0) || (1 < **(int **)cleaned)) {
    QString::reallocData((longlong)cleaned,(AllocationOption)*(undefined8 *)(cleaned + 0x10));
  }
  puVar8 = *(ushort **)(cleaned + 8);
  if ((*(int **)cleaned == (int *)0x0) || (1 < **(int **)cleaned)) {
    QString::reallocData((longlong)cleaned,(AllocationOption)*(undefined8 *)(cleaned + 0x10));
  }
  lVar9 = *(long *)(cleaned + 0x10);
  lVar7 = *(long *)(cleaned + 8);
  for (; puVar8 != (ushort *)(lVar9 * 2 + lVar7); puVar8 = puVar8 + 1) {
    uVar1 = *puVar8;
    if ((((9 < (ushort)(uVar1 - 0x30)) && (0x19 < (ushort)((uVar1 & 0xffdf) - 0x41))) &&
        (uVar1 != 0x2e)) && ((uVar1 != 0x5f && (*puVar8 = 0x5f, in_RDX != (undefined1 *)0x0)))) {
      *in_RDX = 1;
    }
  }
  if (cleanPackageName(QString,bool*)::keywords == '\0') {
    cleanPackageName();
  }
  if (cleanPackageName::keywords.d.size == 0) {
    QVar13.m_data = (storage_type_conflict *)0x8;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar13);
    local_78.d.d = (Data *)local_58.m_size;
    local_78.d.ptr = local_58.m_data;
    local_78.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_78);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar14.m_data = (storage_type_conflict *)0x8;
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar14);
    local_98.d.d = (Data *)local_58.m_size;
    local_98.d.ptr = local_58.m_data;
    local_98.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_98);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar15.m_data = (storage_type_conflict *)0x3;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar15);
    local_b8.d.d = (Data *)local_58.m_size;
    local_b8.d.ptr = local_58.m_data;
    local_b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar16.m_data = (storage_type_conflict *)0x3;
    QVar16.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar16);
    local_d8.d.d = (Data *)local_58.m_size;
    local_d8.d.ptr = local_58.m_data;
    local_d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar17.m_data = (storage_type_conflict *)0x6;
    QVar17.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar17);
    local_f8.d.d = (Data *)local_58.m_size;
    local_f8.d.ptr = local_58.m_data;
    local_f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar18.m_data = (storage_type_conflict *)0x6;
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar18);
    local_118.d.d = (Data *)local_58.m_size;
    local_118.d.ptr = local_58.m_data;
    local_118.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_118);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar19.m_data = (storage_type_conflict *)0x7;
    QVar19.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar19);
    local_138.d.d = (Data *)local_58.m_size;
    local_138.d.ptr = local_58.m_data;
    local_138.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_138);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar20.m_data = (storage_type_conflict *)0x2;
    QVar20.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar20);
    local_158.d.d = (Data *)local_58.m_size;
    local_158.d.ptr = local_58.m_data;
    local_158.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_158);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar21.m_data = (storage_type_conflict *)0x7;
    QVar21.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar21);
    local_178.d.d = (Data *)local_58.m_size;
    local_178.d.ptr = local_58.m_data;
    local_178.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_178);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar22.m_data = (storage_type_conflict *)0xc;
    QVar22.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar22);
    local_198.d.d = (Data *)local_58.m_size;
    local_198.d.ptr = local_58.m_data;
    local_198.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_198);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar23.m_data = (storage_type_conflict *)0x7;
    QVar23.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar23);
    local_1b8.d.d = (Data *)local_58.m_size;
    local_1b8.d.ptr = local_58.m_data;
    local_1b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_1b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar24.m_data = (storage_type_conflict *)0x2;
    QVar24.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar24);
    local_1d8.d.d = (Data *)local_58.m_size;
    local_1d8.d.ptr = local_58.m_data;
    local_1d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_1d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar25.m_data = &DAT_00000004;
    QVar25.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar25);
    local_1f8.d.d = (Data *)local_58.m_size;
    local_1f8.d.ptr = local_58.m_data;
    local_1f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_1f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar26.m_data = (storage_type_conflict *)0x7;
    QVar26.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar26);
    local_218.d.d = (Data *)local_58.m_size;
    local_218.d.ptr = local_58.m_data;
    local_218.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_218);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar27.m_data = &DAT_00000004;
    QVar27.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar27);
    local_238.d.d = (Data *)local_58.m_size;
    local_238.d.ptr = local_58.m_data;
    local_238.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_238);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar28.m_data = (storage_type_conflict *)0x5;
    QVar28.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar28);
    local_258.d.d = (Data *)local_58.m_size;
    local_258.d.ptr = local_58.m_data;
    local_258.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_258);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar29.m_data = (storage_type_conflict *)0x6;
    QVar29.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar29);
    local_278.d.d = (Data *)local_58.m_size;
    local_278.d.ptr = local_58.m_data;
    local_278.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_278);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar30.m_data = (storage_type_conflict *)0xa;
    QVar30.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar30);
    local_298.d.d = (Data *)local_58.m_size;
    local_298.d.ptr = local_58.m_data;
    local_298.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_298);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar31.m_data = (storage_type_conflict *)0x9;
    QVar31.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar31);
    local_2b8.d.d = (Data *)local_58.m_size;
    local_2b8.d.ptr = local_58.m_data;
    local_2b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_2b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar32.m_data = (storage_type_conflict *)0x5;
    QVar32.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar32);
    local_2d8.d.d = (Data *)local_58.m_size;
    local_2d8.d.ptr = local_58.m_data;
    local_2d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_2d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar33.m_data = &DAT_00000004;
    QVar33.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar33);
    local_2f8.d.d = (Data *)local_58.m_size;
    local_2f8.d.ptr = local_58.m_data;
    local_2f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_2f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar34.m_data = &DAT_00000004;
    QVar34.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar34);
    local_318.d.d = (Data *)local_58.m_size;
    local_318.d.ptr = local_58.m_data;
    local_318.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_318);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar35.m_data = (storage_type_conflict *)0x6;
    QVar35.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar35);
    local_338.d.d = (Data *)local_58.m_size;
    local_338.d.ptr = local_58.m_data;
    local_338.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_338);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar36.m_data = (storage_type_conflict *)0x6;
    QVar36.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar36);
    local_358.d.d = (Data *)local_58.m_size;
    local_358.d.ptr = local_58.m_data;
    local_358.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_358);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar37.m_data = (storage_type_conflict *)0x6;
    QVar37.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar37);
    local_378.d.d = (Data *)local_58.m_size;
    local_378.d.ptr = local_58.m_data;
    local_378.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_378);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar38.m_data = &DAT_00000004;
    QVar38.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar38);
    local_398.d.d = (Data *)local_58.m_size;
    local_398.d.ptr = local_58.m_data;
    local_398.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_398);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar39.m_data = &DAT_00000004;
    QVar39.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar39);
    local_3b8.d.d = (Data *)local_58.m_size;
    local_3b8.d.ptr = local_58.m_data;
    local_3b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_3b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar40.m_data = (storage_type_conflict *)0xa;
    QVar40.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar40);
    local_3d8.d.d = (Data *)local_58.m_size;
    local_3d8.d.ptr = local_58.m_data;
    local_3d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_3d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar41.m_data = (storage_type_conflict *)0x6;
    QVar41.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar41);
    local_3f8.d.d = (Data *)local_58.m_size;
    local_3f8.d.ptr = local_58.m_data;
    local_3f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_3f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar42.m_data = (storage_type_conflict *)0x9;
    QVar42.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar42);
    local_418.d.d = (Data *)local_58.m_size;
    local_418.d.ptr = local_58.m_data;
    local_418.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_418);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar43.m_data = (storage_type_conflict *)0x5;
    QVar43.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar43);
    local_438.d.d = (Data *)local_58.m_size;
    local_438.d.ptr = local_58.m_data;
    local_438.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_438);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar44.m_data = (storage_type_conflict *)0x7;
    QVar44.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar44);
    local_458.d.d = (Data *)local_58.m_size;
    local_458.d.ptr = local_58.m_data;
    local_458.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_458);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar45.m_data = (storage_type_conflict *)0x3;
    QVar45.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar45);
    local_478.d.d = (Data *)local_58.m_size;
    local_478.d.ptr = local_58.m_data;
    local_478.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_478);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar46.m_data = (storage_type_conflict *)0x5;
    QVar46.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar46);
    local_498.d.d = (Data *)local_58.m_size;
    local_498.d.ptr = local_58.m_data;
    local_498.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_498);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar47.m_data = (storage_type_conflict *)0x3;
    QVar47.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar47);
    local_4b8.d.d = (Data *)local_58.m_size;
    local_4b8.d.ptr = local_58.m_data;
    local_4b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_4b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar48.m_data = &DAT_00000004;
    QVar48.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar48);
    local_4d8.d.d = (Data *)local_58.m_size;
    local_4d8.d.ptr = local_58.m_data;
    local_4d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_4d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar49.m_data = (storage_type_conflict *)0x5;
    QVar49.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar49);
    local_4f8.d.d = (Data *)local_58.m_size;
    local_4f8.d.ptr = local_58.m_data;
    local_4f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_4f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar50.m_data = (storage_type_conflict *)0x9;
    QVar50.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar50);
    local_518.d.d = (Data *)local_58.m_size;
    local_518.d.ptr = local_58.m_data;
    local_518.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_518);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar51.m_data = (storage_type_conflict *)0x6;
    QVar51.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar51);
    local_538.d.d = (Data *)local_58.m_size;
    local_538.d.ptr = local_58.m_data;
    local_538.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_538);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar52.m_data = &DAT_00000004;
    QVar52.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar52);
    local_558.d.d = (Data *)local_58.m_size;
    local_558.d.ptr = local_58.m_data;
    local_558.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_558);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar53.m_data = (storage_type_conflict *)0x5;
    QVar53.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar53);
    local_578.d.d = (Data *)local_58.m_size;
    local_578.d.ptr = local_58.m_data;
    local_578.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_578);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar54.m_data = (storage_type_conflict *)0x7;
    QVar54.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar54);
    local_598.d.d = (Data *)local_58.m_size;
    local_598.d.ptr = local_58.m_data;
    local_598.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_598);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar55.m_data = &DAT_00000004;
    QVar55.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar55);
    local_5b8.d.d = (Data *)local_58.m_size;
    local_5b8.d.ptr = local_58.m_data;
    local_5b8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_5b8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar56.m_data = (storage_type_conflict *)0x8;
    QVar56.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar56);
    local_5d8.d.d = (Data *)local_58.m_size;
    local_5d8.d.ptr = local_58.m_data;
    local_5d8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_5d8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar57.m_data = (storage_type_conflict *)0x8;
    QVar57.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar57);
    local_5f8.d.d = (Data *)local_58.m_size;
    local_5f8.d.ptr = local_58.m_data;
    local_5f8.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_5f8);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar58.m_data = (storage_type_conflict *)0x5;
    QVar58.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar58);
    local_618.d.d = (Data *)local_58.m_size;
    local_618.d.ptr = local_58.m_data;
    local_618.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_618);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar59.m_data = (storage_type_conflict *)0x5;
    QVar59.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar59);
    local_638.d.d = (Data *)local_58.m_size;
    local_638.d.ptr = local_58.m_data;
    local_638.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_638);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar60.m_data = (storage_type_conflict *)0x6;
    QVar60.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar60);
    local_658.d.d = (Data *)local_58.m_size;
    local_658.d.ptr = local_58.m_data;
    local_658.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_658);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar61.m_data = (storage_type_conflict *)0x5;
    QVar61.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar61);
    local_678.d.d = (Data *)local_58.m_size;
    local_678.d.ptr = local_58.m_data;
    local_678.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_678);
    QList<QString>::end(&cleanPackageName::keywords);
    QVar62.m_data = (storage_type_conflict *)0x5;
    QVar62.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar62);
    local_698.d.d = (Data *)local_58.m_size;
    local_698.d.ptr = local_58.m_data;
    local_698.d.size = (qsizetype)local_48;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&cleanPackageName::keywords,
               cleanPackageName::keywords.d.size,&local_698);
    QList<QString>::end(&cleanPackageName::keywords);
    if (&(local_698.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_698.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_698.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_698.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_698.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_678.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_678.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_678.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_678.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_678.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_658.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_658.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_658.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_658.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_658.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_638.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_638.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_638.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_638.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_638.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_618.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_618.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_618.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_618.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_618.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_5f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_5f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_5f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_5f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_5f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_5d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_5d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_5d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_5d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_5d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_5b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_5b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_5b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_598.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_598.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_598.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_578.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_578.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_578.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_578.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_578.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_558.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_558.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_558.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_558.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_558.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_538.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_538.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_4d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_4b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_498.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_498.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_498.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_498.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_498.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_478.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_478.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_458.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_458.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_438.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_418.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_418.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_418.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_418.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_418.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_3f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_3f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_3f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_3d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_3d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_3b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_3b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_3b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_398.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_398.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_378.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_378.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_318.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_318.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_318.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_2f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_278.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_278.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_238.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_238.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_218.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  lVar7 = *(long *)(cleaned + 0x10);
  lVar9 = -1;
  do {
    local_58.m_data = *(storage_type **)(cleaned + 8);
    local_58.m_size = lVar7;
    lVar7 = QStringView::indexOf(&local_58,(QChar)0x2e,lVar9 + 1,CaseSensitive);
    if (lVar7 == -1) {
      lVar7 = *(long *)(cleaned + 0x10);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_58,(longlong)cleaned);
    if (local_48 == (undefined1 *)0x0) {
LAB_0010ef8b:
      QVar11.m_data = local_58.m_data;
      QVar11.m_size = (qsizetype)local_48;
      cVar6 = QtPrivate::QStringList_contains
                        ((QList *)&cleanPackageName::keywords,QVar11,CaseSensitive);
      lVar9 = lVar7;
      if (cVar6 != '\0') {
        QVar12.m_data = (char *)0x1;
        QVar12.m_size = lVar7;
        QString::insert((longlong)cleaned,QVar12);
        if (in_RDX != (undefined1 *)0x0) {
          *in_RDX = 1;
        }
        lVar9 = lVar7 + 1;
      }
    }
    else {
      if (((QArrayData *)local_58.m_size == (QArrayData *)0x0) ||
         (1 < (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i)) {
        QString::reallocData((longlong)&local_58,(AllocationOption)local_48);
      }
      sVar2 = *local_58.m_data;
      bVar10 = 0xfff5 < (ushort)(sVar2 + L'ￆ');
      if (sVar2 == L'_' || bVar10) {
        QString::insert((longlong)cleaned,(QChar)(char16_t)(lVar9 + 1));
        if (in_RDX != (undefined1 *)0x0) {
          *in_RDX = 1;
        }
        lVar9 = lVar7 + 1;
      }
      if (sVar2 != L'_' && !bVar10) goto LAB_0010ef8b;
    }
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.m_size,2,0x10);
      }
    }
    lVar7 = *(long *)(cleaned + 0x10);
    if (lVar7 <= lVar9) {
      uVar3 = *(undefined4 *)(cleaned + 4);
      uVar4 = *(undefined4 *)(cleaned + 8);
      uVar5 = *(undefined4 *)(cleaned + 0xc);
      cleaned[0] = false;
      cleaned[1] = false;
      cleaned[2] = false;
      cleaned[3] = false;
      cleaned[4] = false;
      cleaned[5] = false;
      cleaned[6] = false;
      cleaned[7] = false;
      cleaned[8] = false;
      cleaned[9] = false;
      cleaned[10] = false;
      cleaned[0xb] = false;
      cleaned[0xc] = false;
      cleaned[0xd] = false;
      cleaned[0xe] = false;
      cleaned[0xf] = false;
      *(undefined4 *)&(__return_storage_ptr__->d).d = *(undefined4 *)cleaned;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar3;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar4;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar5;
      cleaned[0x10] = false;
      cleaned[0x11] = false;
      cleaned[0x12] = false;
      cleaned[0x13] = false;
      cleaned[0x14] = false;
      cleaned[0x15] = false;
      cleaned[0x16] = false;
      cleaned[0x17] = false;
      (__return_storage_ptr__->d).size = lVar7;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QString cleanPackageName(QString packageName, bool *cleaned = nullptr)
{
    auto isLegalChar = [] (QChar c) -> bool {
        ushort ch = c.unicode();
        return (ch >= '0' && ch <= '9') ||
                (ch >= 'A' && ch <= 'Z') ||
                (ch >= 'a' && ch <= 'z') ||
                ch == '.' || ch == '_';
    };

    if (cleaned)
        *cleaned = false;

    for (QChar &c : packageName) {
        if (!isLegalChar(c)) {
            c = u'_';
            if (cleaned)
                *cleaned = true;
        }
    }

    static QStringList keywords;
    if (keywords.isEmpty()) {
        keywords << "abstract"_L1 << "continue"_L1 << "for"_L1
                 << "new"_L1 << "switch"_L1 << "assert"_L1
                 << "default"_L1 << "if"_L1 << "package"_L1
                 << "synchronized"_L1 << "boolean"_L1 << "do"_L1
                 << "goto"_L1 << "private"_L1 << "this"_L1
                 << "break"_L1 << "double"_L1 << "implements"_L1
                 << "protected"_L1 << "throw"_L1 << "byte"_L1
                 << "else"_L1 << "import"_L1 << "public"_L1
                 << "throws"_L1 << "case"_L1 << "enum"_L1
                 << "instanceof"_L1 << "return"_L1 << "transient"_L1
                 << "catch"_L1 << "extends"_L1 << "int"_L1
                 << "short"_L1 << "try"_L1 << "char"_L1
                 << "final"_L1 << "interface"_L1 << "static"_L1
                 << "void"_L1 << "class"_L1 << "finally"_L1
                 << "long"_L1 << "strictfp"_L1 << "volatile"_L1
                 << "const"_L1 << "float"_L1 << "native"_L1
                 << "super"_L1 << "while"_L1;
    }

    // No keywords
    qsizetype index = -1;
    while (index < packageName.size()) {
        qsizetype next = packageName.indexOf(u'.', index + 1);
        if (next == -1)
            next = packageName.size();
        QString word = packageName.mid(index + 1, next - index - 1);
        if (!word.isEmpty()) {
            QChar c = word[0];
            if ((c >= u'0' && c <= u'9') || c == u'_') {
                packageName.insert(index + 1, u'a');
                if (cleaned)
                    *cleaned = true;
                index = next + 1;
                continue;
            }
        }
        if (keywords.contains(word)) {
            packageName.insert(next, "_"_L1);
            if (cleaned)
                *cleaned = true;
            index = next + 1;
        } else {
            index = next;
        }
    }

    return packageName;
}